

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointElement.cpp
# Opt level: O2

void __thiscall iDynTree::JointElement::exitElementScope(JointElement *this)

{
  string *__lhs;
  element_type *peVar1;
  bool bVar2;
  RevoluteJoint *this_00;
  PrismaticJoint *this_01;
  __hashtable *__h;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var3;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>,_false,_true>,_bool>
  pVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_168;
  string errStr;
  JointInfo info;
  
  JointInfo::JointInfo(&info);
  errStr._M_dataplus._M_p = (pointer)0x0;
  errStr._M_string_length = 0;
  std::__shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2> *)&info,
             (__shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2> *)&errStr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&errStr._M_string_length);
  __lhs = &this->m_jointType;
  bVar2 = std::operator==(__lhs,"fixed");
  if (bVar2) {
    std::make_shared<iDynTree::FixedJoint,iDynTree::Transform&>((Transform *)&errStr);
    std::__shared_ptr<iDynTree::IJoint,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<iDynTree::IJoint,(__gnu_cxx::_Lock_policy)2> *)&info,
               (__shared_ptr<iDynTree::FixedJoint,_(__gnu_cxx::_Lock_policy)2> *)&errStr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&errStr._M_string_length);
    p_Var3 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this->m_fixedJoints;
  }
  else {
    bVar2 = std::operator==(__lhs,"revolute");
    if (bVar2) {
LAB_0013a2a0:
      this_00 = (RevoluteJoint *)operator_new(0x218);
      iDynTree::RevoluteJoint::RevoluteJoint(this_00);
      (**(code **)(*(long *)this_00 + 0x30))(this_00,&this->m_jointFrame);
      std::__shared_ptr<iDynTree::IJoint,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<iDynTree::RevoluteJoint,void>
                ((__shared_ptr<iDynTree::IJoint,(__gnu_cxx::_Lock_policy)2> *)&errStr,this_00);
    }
    else {
      bVar2 = std::operator==(__lhs,"continuous");
      if (bVar2) goto LAB_0013a2a0;
      bVar2 = std::operator==(__lhs,"prismatic");
      if (!bVar2) {
        p_Var3 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)0x0;
        goto LAB_0013a2ef;
      }
      this_01 = (PrismaticJoint *)operator_new(0x218);
      iDynTree::PrismaticJoint::PrismaticJoint(this_01);
      (**(code **)(*(long *)this_01 + 0x30))(this_01,&this->m_jointFrame);
      std::__shared_ptr<iDynTree::IJoint,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<iDynTree::PrismaticJoint,void>
                ((__shared_ptr<iDynTree::IJoint,(__gnu_cxx::_Lock_policy)2> *)&errStr,this_01);
    }
    std::__shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2> *)&info,
               (__shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2> *)&errStr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&errStr._M_string_length);
    p_Var3 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this->m_joints;
  }
LAB_0013a2ef:
  if (p_Var3 == (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 *)0x0 ||
      info.joint.super___shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) goto LAB_0013a4f6;
  std::__cxx11::string::_M_assign((string *)&info.parentLinkName);
  std::__cxx11::string::_M_assign((string *)&info.childLinkName);
  iDynTree::Axis::operator=(&info.axis,&this->m_axis);
  if ((this->m_limits).
      super___shared_ptr<iDynTree::JointElement::Limits,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    bVar2 = std::operator==(__lhs,"revolute");
    if (!bVar2) {
      bVar2 = std::operator==(__lhs,"prismatic");
      if (!bVar2) goto LAB_0013a402;
    }
    std::operator+(&bStack_168,"Joint ",&this->m_jointName);
    std::operator+(&errStr,&bStack_168," misses the limit tag.");
    std::__cxx11::string::~string((string *)&bStack_168);
    iDynTree::reportWarning("JointElement","",errStr._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&errStr);
  }
  else {
    (**(code **)(*(long *)info.joint.
                          super___shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                0xd0))(info.joint.super___shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,1);
    peVar1 = (this->m_limits).
             super___shared_ptr<iDynTree::JointElement::Limits,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (**(code **)(*(long *)info.joint.
                          super___shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                0xf0))(SUB84(peVar1->positionLower,0),peVar1->positionUpper,
                       info.joint.super___shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,0);
  }
LAB_0013a402:
  if ((this->m_dynamic_params).
      super___shared_ptr<iDynTree::JointElement::JointDynamicsParams,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    (**(code **)(*(long *)info.joint.
                          super___shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                0x100))(info.joint.super___shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,1);
    (**(code **)(*(long *)info.joint.
                          super___shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                0x108))(SUB84(((this->m_dynamic_params).
                               super___shared_ptr<iDynTree::JointElement::JointDynamicsParams,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->damping,0),
                        info.joint.super___shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,0);
    (**(code **)(*(long *)info.joint.
                          super___shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                0x110))(SUB84(((this->m_dynamic_params).
                               super___shared_ptr<iDynTree::JointElement::JointDynamicsParams,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->staticFriction,0),
                        info.joint.super___shared_ptr<iDynTree::IJoint,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,0);
  }
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_iDynTree::JointElement::JointInfo_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>
              *)&errStr,&this->m_jointName,&info);
  pVar4 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>,std::allocator<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,iDynTree::JointElement::JointInfo>>
                    (p_Var3,&errStr);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iDynTree::JointElement::JointInfo>
           *)&errStr);
  if (((undefined1  [16])pVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::operator+(&bStack_168,"Duplicate joint ",&this->m_jointName);
    std::operator+(&errStr,&bStack_168," found.");
    std::__cxx11::string::~string((string *)&bStack_168);
    iDynTree::reportError("JointElement","",errStr._M_dataplus._M_p);
    iDynTree::XMLElement::getParserState();
    iDynTree::XMLParserState::setParsingError();
    std::__cxx11::string::~string((string *)&errStr);
  }
LAB_0013a4f6:
  JointInfo::~JointInfo(&info);
  return;
}

Assistant:

void JointElement::exitElementScope()
    {
        JointElement::JointInfo info;
        info.joint = nullptr;
        std::unordered_map<std::string, JointElement::JointInfo>* map = nullptr;
        
        if (m_jointType == "fixed")
        {
            info.joint = std::make_shared<FixedJoint>(m_jointFrame);
            map = &m_fixedJoints;
        }
        else if (m_jointType == "revolute" || m_jointType == "continuous")
        {
            RevoluteJoint* rev_joint = new RevoluteJoint();
            rev_joint->setRestTransform(m_jointFrame);
            info.joint = std::shared_ptr<IJoint>(rev_joint);
            map = &m_joints;
        }
        else if (m_jointType == "prismatic")
        {
            PrismaticJoint* prism_joint = new PrismaticJoint();
            prism_joint->setRestTransform(m_jointFrame);
            info.joint = std::shared_ptr<IJoint>(prism_joint);
            map = &m_joints;
        }

        if (info.joint && map) {
            info.parentLinkName = m_parentLink;
            info.childLinkName = m_childLink;
            info.axis = m_axis;

            if (m_limits) {
                // Limits found
                info.joint->enablePosLimits(true);
                info.joint->setPosLimits(0, m_limits->positionLower, m_limits->positionUpper);
            } else if (m_jointType == "revolute" || m_jointType == "prismatic") {
                std::string errStr = "Joint " + m_jointName + " misses the limit tag.";
                reportWarning("JointElement", "", errStr.c_str());
            }

            if(m_dynamic_params) {
                info.joint->setJointDynamicsType(URDFJointDynamics);
                info.joint->setDamping(0, m_dynamic_params->damping);
                info.joint->setStaticFriction(0, m_dynamic_params->staticFriction);
            }

            if (!map->insert(std::unordered_map<std::string, JointElement::JointInfo>::value_type(m_jointName, info)).second) {
                std::string errStr = "Duplicate joint " + m_jointName + " found.";
                reportError("JointElement", "", errStr.c_str());
                getParserState().setParsingError();
            }
        }
    }